

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::ComputeTargetObjectDirectory
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *gt)

{
  int iVar1;
  string *str;
  undefined4 extraout_var;
  char local_d5 [13];
  char *local_c8;
  char local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  undefined1 local_38 [8];
  string dir;
  cmGeneratorTarget *gt_local;
  cmGlobalNinjaGenerator *this_local;
  
  dir.field_2._8_8_ = gt;
  str = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(gt->LocalGenerator);
  cmAlphaNum::cmAlphaNum(&local_68,str);
  cmAlphaNum::cmAlphaNum(&local_98,'/');
  (**(code **)(**(long **)(dir.field_2._8_8_ + 0x10) + 0x70))(&local_b8);
  local_b9 = '/';
  iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x15])();
  local_c8 = (char *)CONCAT44(extraout_var,iVar1);
  local_d5[0] = '/';
  cmStrCat<std::__cxx11::string,char,char_const*,char>
            ((string *)local_38,&local_68,&local_98,&local_b8,&local_b9,&local_c8,local_d5);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::operator=((string *)(dir.field_2._8_8_ + 0x20),(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::ComputeTargetObjectDirectory(
  cmGeneratorTarget* gt) const
{
  // Compute full path to object file directory for this target.
  std::string dir = cmStrCat(gt->LocalGenerator->GetCurrentBinaryDirectory(),
                             '/', gt->LocalGenerator->GetTargetDirectory(gt),
                             '/', this->GetCMakeCFGIntDir(), '/');
  gt->ObjectDirectory = dir;
}